

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O2

int __thiscall
ncnn::Gemm::forward(Gemm *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  size_t sVar2;
  int *piVar3;
  pointer pMVar4;
  uint uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  long lVar30;
  size_t sVar31;
  size_t sVar32;
  int iVar33;
  ulong uVar34;
  size_t *psVar35;
  void *pvVar36;
  size_t *psVar37;
  uint uVar38;
  Option *pOVar39;
  int k;
  float *pfVar40;
  uint uVar41;
  uint uVar42;
  ulong uVar43;
  ulong uVar44;
  int iVar45;
  ulong uVar46;
  int j;
  ulong uVar47;
  Mat *pMVar48;
  float *pfVar49;
  uint uVar50;
  uint uVar51;
  Mat *pMVar52;
  bool bVar53;
  bool bVar54;
  float fVar55;
  Mat local_178;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_128;
  size_t local_120;
  Option *local_118;
  int local_110;
  int local_10c;
  Mat local_108;
  Mat local_b8;
  size_t *local_68;
  int *local_60;
  long local_58;
  void *local_50;
  Mat *local_48;
  ulong local_40;
  void *local_38;
  
  if (this->constantA == 0) {
    pMVar52 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (this->constantB != 0) goto LAB_00457de8;
    pMVar48 = pMVar52 + 1;
  }
  else {
    pMVar52 = &this->A_data;
    if (this->constantB == 0) {
      pMVar48 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    else {
LAB_00457de8:
      pMVar48 = &this->B_data;
    }
  }
  sVar2 = pMVar52->elemsize;
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.allocator = (Allocator *)0x0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  if (this->transA == 0) {
    if (&local_b8 != pMVar52) {
      piVar3 = pMVar52->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      local_b8.data = pMVar52->data;
      local_b8.refcount._0_4_ = SUB84(pMVar52->refcount,0);
      local_b8.refcount._4_4_ = (undefined4)((ulong)pMVar52->refcount >> 0x20);
      local_b8.elemsize._0_4_ = (undefined4)pMVar52->elemsize;
      local_b8.elemsize._4_4_ = (undefined4)(pMVar52->elemsize >> 0x20);
      local_b8.elempack = pMVar52->elempack;
      local_b8.allocator = pMVar52->allocator;
      uVar6 = pMVar52->dims;
      uVar7 = pMVar52->w;
      uVar8 = pMVar52->h;
      uVar9 = pMVar52->d;
      local_b8.w = uVar7;
      local_b8.h = uVar8;
      local_b8.d = uVar9;
      local_b8.c = pMVar52->c;
      local_b8.cstep = pMVar52->cstep;
      local_b8.dims = uVar6;
    }
  }
  else {
    Mat::create(&local_b8,(&pMVar52->h)[(ulong)(pMVar52->dims == 3) * 2],pMVar52->w,sVar2,
                opt->workspace_allocator);
    if (pMVar52->dims == 3) {
      iVar45 = (int)pMVar52->cstep;
    }
    else {
      iVar45 = pMVar52->w;
    }
    uVar43 = 0;
    uVar44 = 0;
    if (0 < local_b8.w) {
      uVar44 = (ulong)(uint)local_b8.w;
    }
    uVar34 = (ulong)(uint)local_b8.h;
    pvVar36 = local_b8.data;
    if (local_b8.h < 1) {
      uVar34 = uVar43;
    }
    for (; uVar43 != uVar34; uVar43 = uVar43 + 1) {
      uVar46 = uVar43;
      for (uVar47 = 0; uVar44 != uVar47; uVar47 = uVar47 + 1) {
        *(undefined4 *)((long)pvVar36 + uVar47 * 4) =
             *(undefined4 *)((long)pMVar52->data + uVar46 * 4);
        uVar46 = uVar46 + (long)iVar45;
      }
      pvVar36 = (void *)((long)pvVar36 +
                        (long)local_b8.w *
                        CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
    }
  }
  local_108.cstep = 0;
  local_108.data = (void *)0x0;
  local_108.refcount._0_4_ = 0;
  local_108.refcount._4_4_ = 0;
  local_108.elemsize._0_4_ = 0;
  local_108.elemsize._4_4_ = 0;
  local_108.elempack = 0;
  local_108.allocator = (Allocator *)0x0;
  local_108.dims = 0;
  local_108.w = 0;
  local_108.h = 0;
  local_108.d = 0;
  local_108.c = 0;
  local_128 = top_blobs;
  local_120 = sVar2;
  local_118 = opt;
  if (this->transB == 0) {
    Mat::create(&local_108,(&pMVar48->h)[(ulong)(pMVar48->dims == 3) * 2],pMVar48->w,sVar2,
                opt->workspace_allocator);
    if (pMVar48->dims == 3) {
      iVar45 = (int)pMVar48->cstep;
    }
    else {
      iVar45 = pMVar48->w;
    }
    uVar43 = 0;
    uVar44 = 0;
    if (0 < local_108.w) {
      uVar44 = (ulong)(uint)local_108.w;
    }
    uVar34 = (ulong)(uint)local_108.h;
    pvVar36 = local_108.data;
    if (local_108.h < 1) {
      uVar34 = uVar43;
    }
    for (; iVar33 = local_108.dims, uVar50 = local_108.h, uVar43 != uVar34; uVar43 = uVar43 + 1) {
      uVar46 = uVar43;
      for (uVar47 = 0; uVar44 != uVar47; uVar47 = uVar47 + 1) {
        *(undefined4 *)((long)pvVar36 + uVar47 * 4) =
             *(undefined4 *)((long)pMVar48->data + uVar46 * 4);
        uVar46 = uVar46 + (long)iVar45;
      }
      pvVar36 = (void *)((long)pvVar36 +
                        (long)local_108.w *
                        CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize));
    }
  }
  else if (&local_108 == pMVar48) {
    iVar33 = 0;
    uVar50 = 0;
  }
  else {
    piVar3 = pMVar48->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    local_108.data = pMVar48->data;
    local_108.refcount._0_4_ = SUB84(pMVar48->refcount,0);
    local_108.refcount._4_4_ = (undefined4)((ulong)pMVar48->refcount >> 0x20);
    local_108.elemsize._0_4_ = (undefined4)pMVar48->elemsize;
    local_108.elemsize._4_4_ = (undefined4)(pMVar48->elemsize >> 0x20);
    local_108.elempack = pMVar48->elempack;
    local_108.allocator = pMVar48->allocator;
    uVar10 = pMVar48->dims;
    uVar11 = pMVar48->w;
    uVar12 = pMVar48->h;
    uVar13 = pMVar48->d;
    local_108.w = uVar11;
    local_108.h = uVar12;
    local_108.d = uVar13;
    local_108.c = pMVar48->c;
    local_108.cstep = pMVar48->cstep;
    iVar33 = pMVar48->dims;
    uVar50 = pMVar48->h;
    local_108.dims = uVar10;
  }
  uVar5 = local_b8.w;
  uVar1 = (&local_b8.h)[(ulong)(local_b8.dims == 3) * 2];
  if (iVar33 == 3) {
    uVar50 = local_108.c;
  }
  if (this->constantC != 0) {
    pfVar49 = (float *)(this->C_data).data;
    uVar51 = this->constant_broadcast_type_C;
    goto LAB_004585a8;
  }
  if (this->constantB == 0 || this->constantA == 0) {
    if (this->constantA == 0) {
      if (this->constantB == 0) {
        pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar4 == 0xd8) {
          local_178.data = pMVar4[2].data;
          piVar3 = pMVar4[2].refcount;
          local_178.refcount._0_4_ = SUB84(piVar3,0);
          local_178.refcount._4_4_ = (undefined4)((ulong)piVar3 >> 0x20);
          local_178.elemsize._0_4_ = (undefined4)pMVar4[2].elemsize;
          local_178.elemsize._4_4_ = (undefined4)(pMVar4[2].elemsize >> 0x20);
          local_178.elempack = pMVar4[2].elempack;
          local_178.allocator = pMVar4[2].allocator;
          uVar26 = pMVar4[2].dims;
          uVar27 = pMVar4[2].w;
          uVar28 = pMVar4[2].h;
          uVar29 = pMVar4[2].d;
          local_178.c = pMVar4[2].c;
          local_178.cstep = pMVar4[2].cstep;
          local_178.dims = uVar26;
          local_178.w = uVar27;
          local_178.h = uVar28;
          local_178.d = uVar29;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
        }
        else {
          local_178.cstep = 0;
          local_178.data = (float *)0x0;
          local_178.refcount._0_4_ = 0;
          local_178.refcount._4_4_ = 0;
          local_178.elemsize._0_4_ = 0;
          local_178.elemsize._4_4_ = 0;
          local_178.elempack = 0;
          local_178.allocator = (Allocator *)0x0;
          local_178.dims = 0;
          local_178.w = 0;
          local_178.h = 0;
          local_178.d = 0;
          local_178.c = 0;
          Mat::create(&local_178,0,4,(Allocator *)0x0);
        }
        pfVar49 = (float *)local_178.data;
        piVar3 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_178.allocator == (Allocator *)0x0) goto LAB_00458519;
            (*(local_178.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      else {
        pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar4 == 0x90) {
          local_178.data = pMVar4[1].data;
          piVar3 = pMVar4[1].refcount;
          local_178.refcount._0_4_ = SUB84(piVar3,0);
          local_178.refcount._4_4_ = (undefined4)((ulong)piVar3 >> 0x20);
          local_178.elemsize._0_4_ = (undefined4)pMVar4[1].elemsize;
          local_178.elemsize._4_4_ = (undefined4)(pMVar4[1].elemsize >> 0x20);
          local_178.elempack = pMVar4[1].elempack;
          local_178.allocator = pMVar4[1].allocator;
          uVar22 = pMVar4[1].dims;
          uVar23 = pMVar4[1].w;
          uVar24 = pMVar4[1].h;
          uVar25 = pMVar4[1].d;
          local_178.c = pMVar4[1].c;
          local_178.cstep = pMVar4[1].cstep;
          local_178.dims = uVar22;
          local_178.w = uVar23;
          local_178.h = uVar24;
          local_178.d = uVar25;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
        }
        else {
          local_178.cstep = 0;
          local_178.data = (float *)0x0;
          local_178.refcount._0_4_ = 0;
          local_178.refcount._4_4_ = 0;
          local_178.elemsize._0_4_ = 0;
          local_178.elemsize._4_4_ = 0;
          local_178.elempack = 0;
          local_178.allocator = (Allocator *)0x0;
          local_178.dims = 0;
          local_178.w = 0;
          local_178.h = 0;
          local_178.d = 0;
          local_178.c = 0;
          Mat::create(&local_178,0,4,(Allocator *)0x0);
        }
        pfVar49 = (float *)local_178.data;
        piVar3 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_178.allocator == (Allocator *)0x0) {
LAB_00458519:
              pfVar49 = (float *)local_178.data;
              free(local_178.data);
            }
            else {
              (*(local_178.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
    else {
      pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pMVar4 == 0x90) {
        local_178.data = pMVar4[1].data;
        piVar3 = pMVar4[1].refcount;
        local_178.refcount._0_4_ = SUB84(piVar3,0);
        local_178.refcount._4_4_ = (undefined4)((ulong)piVar3 >> 0x20);
        local_178.elemsize._0_4_ = (undefined4)pMVar4[1].elemsize;
        local_178.elemsize._4_4_ = (undefined4)(pMVar4[1].elemsize >> 0x20);
        local_178.elempack = pMVar4[1].elempack;
        local_178.allocator = pMVar4[1].allocator;
        uVar14 = pMVar4[1].dims;
        uVar15 = pMVar4[1].w;
        uVar16 = pMVar4[1].h;
        uVar17 = pMVar4[1].d;
        local_178.c = pMVar4[1].c;
        local_178.cstep = pMVar4[1].cstep;
        local_178.dims = uVar14;
        local_178.w = uVar15;
        local_178.h = uVar16;
        local_178.d = uVar17;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
      }
      else {
        local_178.cstep = 0;
        local_178.data = (float *)0x0;
        local_178.refcount._0_4_ = 0;
        local_178.refcount._4_4_ = 0;
        local_178.elemsize._0_4_ = 0;
        local_178.elemsize._4_4_ = 0;
        local_178.elempack = 0;
        local_178.allocator = (Allocator *)0x0;
        local_178.dims = 0;
        local_178.w = 0;
        local_178.h = 0;
        local_178.d = 0;
        local_178.c = 0;
        Mat::create(&local_178,0,4,(Allocator *)0x0);
      }
      pfVar49 = (float *)local_178.data;
      piVar3 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_178.allocator == (Allocator *)0x0) goto LAB_00458519;
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pMVar4 == 0x48) {
      local_178.data = pMVar4->data;
      piVar3 = pMVar4->refcount;
      local_178.refcount._0_4_ = SUB84(piVar3,0);
      local_178.refcount._4_4_ = (undefined4)((ulong)piVar3 >> 0x20);
      local_178.elemsize._0_4_ = (undefined4)pMVar4->elemsize;
      local_178.elemsize._4_4_ = (undefined4)(pMVar4->elemsize >> 0x20);
      local_178.elempack = pMVar4->elempack;
      local_178.allocator = pMVar4->allocator;
      uVar18 = pMVar4->dims;
      uVar19 = pMVar4->w;
      uVar20 = pMVar4->h;
      uVar21 = pMVar4->d;
      local_178.c = pMVar4->c;
      local_178.cstep = pMVar4->cstep;
      local_178.dims = uVar18;
      local_178.w = uVar19;
      local_178.h = uVar20;
      local_178.d = uVar21;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
    }
    else {
      local_178.cstep = 0;
      local_178.data = (float *)0x0;
      local_178.refcount._0_4_ = 0;
      local_178.refcount._4_4_ = 0;
      local_178.elemsize._0_4_ = 0;
      local_178.elemsize._4_4_ = 0;
      local_178.elempack = 0;
      local_178.allocator = (Allocator *)0x0;
      local_178.dims = 0;
      local_178.w = 0;
      local_178.h = 0;
      local_178.d = 0;
      local_178.c = 0;
      Mat::create(&local_178,0,4,(Allocator *)0x0);
    }
    pfVar49 = (float *)local_178.data;
    piVar3 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_178.allocator == (Allocator *)0x0) goto LAB_00458519;
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (pfVar49 == (float *)0x0) {
    pfVar49 = (float *)0x0;
    uVar51 = 0;
  }
  else {
    pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    iVar45 = pMVar4[-1].dims;
    uVar51 = pMVar4[-1].w;
    bVar53 = uVar51 == uVar50;
    uVar41 = (uint)(uVar51 == uVar1 && iVar45 == 1);
    uVar38 = uVar41;
    if (bVar53) {
      uVar38 = 4;
    }
    if (iVar45 != 1) {
      uVar38 = uVar41;
    }
    uVar41 = pMVar4[-1].h;
    uVar42 = 2;
    if (uVar41 != uVar1) {
      uVar42 = uVar38;
    }
    if (uVar51 != 1) {
      uVar42 = uVar38;
    }
    bVar54 = iVar45 != 2;
    if (bVar54) {
      uVar42 = uVar38;
    }
    uVar38 = 3;
    if (uVar41 != uVar1) {
      uVar38 = uVar42;
    }
    if (bVar54 || !bVar53) {
      uVar38 = uVar42;
    }
    uVar51 = 4;
    if (uVar41 != 1) {
      uVar51 = uVar38;
    }
    if (bVar54 || !bVar53) {
      uVar51 = uVar38;
    }
  }
LAB_004585a8:
  uVar38 = uVar50;
  uVar41 = uVar1;
  if (this->output_transpose == 0) {
    uVar38 = uVar1;
    uVar41 = uVar50;
  }
  pMVar52 = (local_128->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (this->output_N1M == 0) {
    Mat::create(pMVar52,uVar41,uVar38,local_120,local_118->blob_allocator);
  }
  else {
    Mat::create(pMVar52,uVar41,1,uVar38,local_120,local_118->blob_allocator);
  }
  local_38 = pMVar52->data;
  iVar45 = -100;
  if ((local_38 != (void *)0x0) && ((long)pMVar52->c * pMVar52->cstep != 0)) {
    local_10c = local_b8.dims;
    local_110 = local_108.dims;
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    local_118 = (Option *)0x0;
    if (0 < (int)uVar50) {
      local_118 = (Option *)(ulong)uVar50;
    }
    local_50 = local_b8.data;
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    local_40 = (ulong)uVar1;
    local_58 = (long)(int)uVar50;
    local_60 = &pMVar52->w;
    local_68 = &pMVar52->cstep;
    local_128 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x0;
    for (uVar43 = 0; uVar43 != local_40; uVar43 = uVar43 + 1) {
      psVar35 = (size_t *)local_60;
      if (pMVar52->dims == 3) {
        psVar35 = local_68;
      }
      psVar37 = (size_t *)&local_b8.w;
      if (local_b8.dims == 3) {
        psVar37 = &local_b8.cstep;
      }
      sVar2 = *psVar35;
      sVar31 = *psVar37;
      psVar35 = (size_t *)&local_108.w;
      if (local_108.dims == 3) {
        psVar35 = &local_108.cstep;
      }
      sVar32 = *psVar35;
      local_120 = uVar43 * local_58;
      iVar45 = this->output_transpose;
      pvVar36 = local_108.data;
      for (pOVar39 = (Option *)0x0; pOVar39 != local_118; pOVar39 = (Option *)&pOVar39->field_0x1) {
        if (pfVar49 == (float *)0x0) {
          fVar55 = 0.0;
        }
        else {
          pfVar40 = pfVar49;
          switch(uVar51) {
          case 0:
            break;
          case 1:
          case 2:
            pfVar40 = pfVar49 + uVar43;
            break;
          case 3:
            pfVar40 = pfVar49 + (long)(&pOVar39->lightmode + local_120);
            break;
          case 4:
            pfVar40 = pfVar49 + (long)pOVar39;
            break;
          default:
            fVar55 = 0.0;
            goto LAB_004587c6;
          }
          fVar55 = *pfVar40;
LAB_004587c6:
          fVar55 = fVar55 * this->beta;
        }
        for (uVar44 = 0; uVar5 != uVar44; uVar44 = uVar44 + 1) {
          fVar55 = fVar55 + *(float *)((long)pvVar36 + uVar44 * 4) *
                            *(float *)((long)local_b8.data +
                                      uVar44 * 4 + (long)(int)sVar31 * (long)local_128);
        }
        lVar30 = (long)pOVar39 * (long)(int)sVar2 * 4 + uVar43 * 4;
        if (iVar45 == 0) {
          lVar30 = (long)pOVar39 * 4 + uVar43 * (long)(int)sVar2 * 4;
        }
        *(float *)((long)local_38 + lVar30) = fVar55 * this->alpha;
        pvVar36 = (void *)((long)pvVar36 + (long)(int)sVar32 * 4);
      }
      local_128 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                  ((long)&(local_128->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start + 4);
    }
    iVar45 = 0;
    local_48 = pMVar52;
  }
  piVar3 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        free(local_108.data);
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        free(local_b8.data);
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar45;
}

Assistant:

int Gemm::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A0 = constantA ? A_data : bottom_blobs[0];
    const Mat& B0 = constantB ? B_data : constantA ? bottom_blobs[0] : bottom_blobs[1];

    size_t elemsize = A0.elemsize;

    Mat A;
    if (transA == 0)
    {
        A = A0;
    }
    else
    {
        // transpose A to row-major
        A.create((A0.dims == 3 ? A0.c : A0.h), A0.w, elemsize, opt.workspace_allocator);

        const int A0_hstep = A0.dims == 3 ? (int)A0.cstep : A0.w;

        for (int i = 0; i < A.h; i++)
        {
            float* ptr = A.row(i);
            for (int j = 0; j < A.w; j++)
            {
                ptr[j] = A0[j * A0_hstep + i];
            }
        }
    }

    Mat B;
    if (transB == 0)
    {
        // transpose B to col-major
        B.create((B0.dims == 3 ? B0.c : B0.h), B0.w, elemsize, opt.workspace_allocator);

        const int B0_hstep = B0.dims == 3 ? (int)B0.cstep : B0.w;

        for (int i = 0; i < B.h; i++)
        {
            float* ptr = B.row(i);
            for (int j = 0; j < B.w; j++)
            {
                ptr[j] = B0[j * B0_hstep + i];
            }
        }
    }
    else
    {
        B = B0;
    }

    const int M = A.dims == 3 ? A.c : A.h;
    const int K = A.w; // assert A.w == B.w
    const int N = B.dims == 3 ? B.c : B.h;

    const float* ptrC = 0;
    int broadcast_type_C = 0;
    if (constantC)
    {
        ptrC = C_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            ptrC = bottom_blobs.size() == 1 ? bottom_blobs[0] : 0;
        }
        else if (constantA)
        {
            ptrC = bottom_blobs.size() == 2 ? bottom_blobs[1] : 0;
        }
        else if (constantB)
        {
            ptrC = bottom_blobs.size() == 2 ? bottom_blobs[1] : 0;
        }
        else
        {
            ptrC = bottom_blobs.size() == 3 ? bottom_blobs[2] : 0;
        }

        if (ptrC)
        {
            const Mat& C = bottom_blobs[bottom_blobs.size() - 1];

            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }
        }
    }

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N, elemsize, opt.blob_allocator);
        else
            top_blob.create(M, N, elemsize, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M, elemsize, opt.blob_allocator);
        else
            top_blob.create(N, M, elemsize, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < M; i++)
    {
        const int out_hstep = top_blob.dims == 3 ? (int)top_blob.cstep : top_blob.w;

        const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;
        const int B_hstep = B.dims == 3 ? (int)B.cstep : B.w;

        const float* ptrA = (const float*)A + i * A_hstep;

        for (int j = 0; j < N; j++)
        {
            const float* ptrB = (const float*)B + j * B_hstep;

            float sum = 0.f;
            if (ptrC)
            {
                if (broadcast_type_C == 0)
                {
                    sum = ptrC[0];
                }
                if (broadcast_type_C == 1)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 2)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 3)
                {
                    sum = ptrC[i * N + j];
                }
                if (broadcast_type_C == 4)
                {
                    sum = ptrC[j];
                }

                sum *= beta;
            }

            for (int k = 0; k < K; k++)
            {
                sum += ptrA[k] * ptrB[k];
            }

            sum *= alpha;

            if (output_transpose)
            {
                top_blob[j * out_hstep + i] = sum;
            }
            else
            {
                top_blob[i * out_hstep + j] = sum;
            }
        }
    }

    return 0;
}